

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4c.c
# Opt level: O0

int md_is_link_destination_A
              (MD_CTX *ctx,MD_OFFSET beg,MD_OFFSET max_end,MD_OFFSET *p_end,
              MD_OFFSET *p_contents_beg,MD_OFFSET *p_contents_end)

{
  MD_OFFSET off;
  MD_OFFSET *p_contents_end_local;
  MD_OFFSET *p_contents_beg_local;
  MD_OFFSET *p_end_local;
  MD_OFFSET max_end_local;
  MD_OFFSET beg_local;
  MD_CTX *ctx_local;
  
  if ((beg < max_end) && (ctx->text[beg] == '<')) {
    off = beg + 1;
    while (off < max_end) {
      if (((ctx->text[off] == '\\') && (off + 1 < max_end)) &&
         (((((0x20 < (byte)ctx->text[off + 1] && ((byte)ctx->text[off + 1] < 0x30)) ||
            ((0x39 < (byte)ctx->text[off + 1] && ((byte)ctx->text[off + 1] < 0x41)))) ||
           ((0x5a < (byte)ctx->text[off + 1] && ((byte)ctx->text[off + 1] < 0x61)))) ||
          ((0x7a < (byte)ctx->text[off + 1] && ((byte)ctx->text[off + 1] < 0x7f)))))) {
        off = off + 2;
      }
      else {
        if ((ctx->text[off] == '\r') || ((ctx->text[off] == '\n' || (ctx->text[off] == '<')))) {
          return 0;
        }
        if (ctx->text[off] == '>') {
          *p_contents_beg = beg + 1;
          *p_contents_end = off;
          *p_end = off + 1;
          return 1;
        }
        off = off + 1;
      }
    }
  }
  return 0;
}

Assistant:

static int
md_is_link_destination_A(MD_CTX* ctx, OFF beg, OFF max_end, OFF* p_end,
                         OFF* p_contents_beg, OFF* p_contents_end)
{
    OFF off = beg;

    if(off >= max_end  ||  CH(off) != _T('<'))
        return FALSE;
    off++;

    while(off < max_end) {
        if(CH(off) == _T('\\')  &&  off+1 < max_end  &&  ISPUNCT(off+1)) {
            off += 2;
            continue;
        }

        if(ISNEWLINE(off)  ||  CH(off) == _T('<'))
            return FALSE;

        if(CH(off) == _T('>')) {
            /* Success. */
            *p_contents_beg = beg+1;
            *p_contents_end = off;
            *p_end = off+1;
            return TRUE;
        }

        off++;
    }

    return FALSE;
}